

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall despot::util::tinyxml::TiXmlAttribute::SetIntValue(TiXmlAttribute *this,int _value)

{
  char buf [64];
  
  snprintf(buf,0x40,"%d",_value);
  TiXmlString::operator=(&this->value,buf);
  return;
}

Assistant:

void TiXmlAttribute::SetIntValue(int _value) {
	char buf[64];
#if defined(TIXML_SNPRINTF)
	TIXML_SNPRINTF(buf, sizeof(buf), "%d", _value);
#else
	sprintf (buf, "%d", _value);
#endif
	SetValue(buf);
}